

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
set_connection(TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this,
              Path *path)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer this_00;
  
  pPVar1 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back(&this->_paths,path);
  return;
}

Assistant:

void set_connection(const Path &path) {
    _paths.clear();
    _paths.push_back(path);
  }